

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O0

void __thiscall
wasm::EquivalentClass::deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::
ParamInfo>>&,bool)::DeepValueIterator::DeepValueIterator(wasm::Expression___
          (void *this,Expression **root)

{
  Expression **local_18;
  Expression **root_local;
  DeepValueIterator *this_local;
  
  local_18 = root;
  root_local = (Expression **)this;
  SmallVector<wasm::Expression_**,_10UL>::SmallVector
            ((SmallVector<wasm::Expression_**,_10UL> *)this);
  SmallVector<wasm::Expression_**,_10UL>::push_back
            ((SmallVector<wasm::Expression_**,_10UL> *)this,&local_18);
  return;
}

Assistant:

DeepValueIterator(Expression** root) { tasks.push_back(root); }